

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O1

void __thiscall QGraphicsLayoutItem::setGeometry(QGraphicsLayoutItem *this,QRectF *rect)

{
  QGraphicsLayoutItemPrivate *pQVar1;
  qreal qVar2;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  QSizeF QVar4;
  QSizeF local_48;
  QSizeF local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  local_38.wd = -1.0;
  local_38.ht = -1.0;
  auVar3._0_8_ = rect->w;
  auVar3._8_8_ = rect->h;
  QVar4 = effectiveSizeHint(this,MinimumSize,&local_38);
  auVar3 = maxpd((undefined1  [16])QVar4,auVar3);
  local_48.wd = -1.0;
  local_48.ht = -1.0;
  QVar4 = effectiveSizeHint(this,MaximumSize,&local_48);
  auVar3 = minpd(auVar3,(undefined1  [16])QVar4);
  qVar2 = rect->yp;
  (pQVar1->geom).xp = rect->xp;
  (pQVar1->geom).yp = qVar2;
  (pQVar1->geom).w = (qreal)auVar3._0_8_;
  (pQVar1->geom).h = (qreal)auVar3._8_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsLayoutItem::setGeometry(const QRectF &rect)
{
    Q_D(QGraphicsLayoutItem);
    QSizeF effectiveSize = rect.size().expandedTo(effectiveSizeHint(Qt::MinimumSize))
                                .boundedTo(effectiveSizeHint(Qt::MaximumSize));
    d->geom = QRectF(rect.topLeft(), effectiveSize);
}